

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O2

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  byte bVar1;
  int stride;
  byte *pbVar2;
  VP8LDecoder *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ALPHDecoder *pAVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  VP8StatusCode error;
  int iVar12;
  uint8_t *puVar13;
  
  iVar6 = io->crop_bottom;
  if (iVar6 < num_rows + row || (num_rows < 1 || row < 0)) {
    return (uint8_t *)0x0;
  }
  stride = io->width;
  if (dec->is_alpha_decoded != 0) goto LAB_00123917;
  pAVar8 = dec->alph_dec;
  if (pAVar8 == (ALPHDecoder *)0x0) {
    pAVar8 = (ALPHDecoder *)WebPSafeCalloc(1,0xd8);
    dec->alph_dec = pAVar8;
    if (pAVar8 == (ALPHDecoder *)0x0) {
      VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
      return (uint8_t *)0x0;
    }
    puVar9 = (uint8_t *)WebPSafeMalloc((long)io->crop_bottom * (long)io->width,1);
    dec->alpha_plane_mem = puVar9;
    if (puVar9 == (uint8_t *)0x0) {
      iVar5 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"Alpha decoder initialization failed.");
      if (iVar5 == 0) goto LAB_00123bc8;
      puVar9 = dec->alpha_plane;
    }
    else {
      dec->alpha_plane = puVar9;
      dec->alpha_prev_line = (uint8_t *)0x0;
    }
    pAVar8 = dec->alph_dec;
    pbVar2 = dec->alpha_data;
    uVar11 = dec->alpha_data_size;
    VP8FiltersInit();
    pAVar8->output = puVar9;
    iVar5 = io->height;
    pAVar8->width = io->width;
    pAVar8->height = iVar5;
    if (1 < uVar11) {
      bVar1 = *pbVar2;
      pAVar8->method = bVar1 & 3;
      pAVar8->filter = *pbVar2 >> 2 & WEBP_FILTER_GRADIENT;
      uVar7 = *pbVar2 >> 4 & 3;
      pAVar8->pre_processing = uVar7;
      if ((((byte)(bVar1 & 3) < 2) && ((byte)uVar7 < 2)) && (*pbVar2 < 0x40)) {
        iVar5 = VP8InitIoInternal(&pAVar8->io,0x210);
        if (iVar5 != 0) {
          uVar11 = uVar11 - 1;
          WebPInitCustomIo((WebPDecParams *)0x0,&pAVar8->io);
          (pAVar8->io).opaque = pAVar8;
          iVar5 = io->height;
          (pAVar8->io).width = io->width;
          (pAVar8->io).height = iVar5;
          iVar5 = io->crop_left;
          iVar12 = io->crop_right;
          iVar4 = io->crop_top;
          (pAVar8->io).use_cropping = io->use_cropping;
          (pAVar8->io).crop_left = iVar5;
          (pAVar8->io).crop_right = iVar12;
          (pAVar8->io).crop_top = iVar4;
          (pAVar8->io).crop_bottom = io->crop_bottom;
          if (pAVar8->method == 0) {
            uVar7 = (uint)((ulong)((long)pAVar8->height * (long)pAVar8->width) <= uVar11);
          }
          else {
            uVar7 = VP8LDecodeAlphaHeader(pAVar8,pbVar2 + 1,uVar11);
          }
          if (uVar7 != 0) {
            pAVar8 = dec->alph_dec;
            if (pAVar8->pre_processing == 1) {
              num_rows = iVar6 - row;
            }
            else {
              dec->alpha_dithering = 0;
            }
            goto LAB_00123945;
          }
        }
      }
    }
    pVVar3 = dec->alph_dec->vp8l_dec;
    if (pVVar3 == (VP8LDecoder *)0x0) {
      error = VP8_STATUS_OUT_OF_MEMORY;
    }
    else {
      error = pVVar3->status;
    }
    VP8SetError(dec,error,"Alpha decoder initialization failed.");
  }
  else {
LAB_00123945:
    iVar6 = (pAVar8->io).crop_bottom;
    if (pAVar8->method == 0) {
      iVar5 = pAVar8->width;
      puVar9 = dec->alpha_prev_line;
      puVar10 = dec->alpha_data + (long)(iVar5 * row) + 1;
      puVar13 = dec->alpha_plane + iVar5 * row;
      iVar12 = 0;
      if (0 < num_rows) {
        iVar12 = num_rows;
      }
      while (iVar12 != 0) {
        (*WebPUnfilters[pAVar8->filter])(puVar9,puVar10,puVar13,iVar5);
        puVar10 = puVar10 + iVar5;
        puVar9 = puVar13;
        puVar13 = puVar13 + iVar5;
        iVar12 = iVar12 + -1;
      }
      dec->alpha_prev_line = puVar9;
    }
    else {
      iVar5 = VP8LDecodeAlphaImageStream(pAVar8,num_rows + row);
      if (iVar5 == 0) goto LAB_00123bc8;
    }
    if (num_rows + row < iVar6) {
      if (dec->is_alpha_decoded == 0) goto LAB_00123917;
    }
    else {
      dec->is_alpha_decoded = 1;
    }
    ALPHDelete(dec->alph_dec);
    dec->alph_dec = (ALPHDecoder *)0x0;
    if ((dec->alpha_dithering < 1) ||
       (iVar6 = WebPDequantizeLevels
                          (dec->alpha_plane + (long)io->crop_left + (long)(io->crop_top * stride),
                           io->crop_right - io->crop_left,io->crop_bottom - io->crop_top,stride,
                           dec->alpha_dithering), iVar6 != 0)) {
LAB_00123917:
      return dec->alpha_plane + stride * row;
    }
  }
LAB_00123bc8:
  WebPDeallocateAlphaMemory(dec);
  return (uint8_t *)0x0;
}

Assistant:

WEBP_NODISCARD const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                                     const VP8Io* const io,
                                                     int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded) {
    if (dec->alph_dec == NULL) {    // Initialize decoder.
      dec->alph_dec = ALPHNew();
      if (dec->alph_dec == NULL) {
        VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                    "Alpha decoder initialization failed.");
        return NULL;
      }
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec, dec->alpha_data, dec->alpha_data_size,
                    io, dec->alpha_plane)) {
        VP8LDecoder* const vp8l_dec = dec->alph_dec->vp8l_dec;
        VP8SetError(dec,
                    (vp8l_dec == NULL) ? VP8_STATUS_OUT_OF_MEMORY
                                       : vp8l_dec->status,
                    "Alpha decoder initialization failed.");
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec->pre_processing != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering = 0;    // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded) {   // finished?
      ALPHDelete(dec->alph_dec);
      dec->alph_dec = NULL;
      if (dec->alpha_dithering > 0) {
        uint8_t* const alpha = dec->alpha_plane + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}